

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::drawConvexPolygon(QPainter *this,QPoint *points,int pointCount)

{
  long lVar1;
  bool bVar2;
  QPainterPrivate *this_00;
  pointer pQVar3;
  pointer pQVar4;
  FillRule in_EDX;
  QPainterPath *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  int i;
  uint emulationSpecifier;
  QPainterPrivate *d;
  QPainterPath polygonPath;
  DrawOperation in_stack_00000074;
  QPainterPath *in_stack_00000078;
  QPainterPrivate *in_stack_00000080;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffb8;
  QPainterPath *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QPainter *)0x59a3be);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x59a3d4);
  if ((bVar2) && (1 < (int)in_EDX)) {
    if (this_00->extended == (QPaintEngineEx *)0x0) {
      QPainterPrivate::updateState
                (this_00,(unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      pQVar3 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                         ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x59a43b
                         );
      uVar6 = pQVar3->emulationSpecifier;
      if (uVar6 == 0) {
        pQVar4 = std::unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>::operator->
                           ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)
                            0x59a508);
        (*pQVar4->_vptr_QPaintEngine[0xf])(pQVar4,in_RSI,(ulong)in_EDX,2);
      }
      else {
        QPointF::QPointF((QPointF *)this_00,(QPoint *)CONCAT44(uVar6,in_stack_ffffffffffffffa8));
        QPainterPath::QPainterPath
                  ((QPainterPath *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8),(QPointF *)this_00);
        for (iVar5 = 1; iVar5 < (int)in_EDX; iVar5 = iVar5 + 1) {
          QPointF::QPointF((QPointF *)this_00,(QPoint *)CONCAT44(uVar6,iVar5));
          QPainterPath::lineTo(in_stack_ffffffffffffffd0,in_RDI);
        }
        QPainterPath::closeSubpath((QPainterPath *)this_00);
        QPainterPath::setFillRule(in_RSI,in_EDX);
        QPainterPrivate::draw_helper(in_stack_00000080,in_stack_00000078,in_stack_00000074);
        QPainterPath::~QPainterPath((QPainterPath *)0x59a4f5);
      }
    }
    else {
      (*(this_00->extended->super_QPaintEngine)._vptr_QPaintEngine[0xf])
                (this_00->extended,in_RSI,(ulong)in_EDX,2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainter::drawConvexPolygon(const QPoint *points, int pointCount)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawConvexPolygon(), count=%d\n", pointCount);
#endif

    Q_D(QPainter);

    if (!d->engine || pointCount < 2)
        return;

    if (d->extended) {
        d->extended->drawPolygon(points, pointCount, QPaintEngine::ConvexMode);
        return;
    }

    d->updateState(d->state);

    uint emulationSpecifier = d->state->emulationSpecifier;

    if (emulationSpecifier) {
        QPainterPath polygonPath(points[0]);
        for (int i=1; i<pointCount; ++i)
            polygonPath.lineTo(points[i]);
        polygonPath.closeSubpath();
        polygonPath.setFillRule(Qt::WindingFill);
        d->draw_helper(polygonPath);
        return;
    }

    d->engine->drawPolygon(points, pointCount, QPaintEngine::ConvexMode);
}